

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O2

void __thiscall
cfd::core::AbstractTxInReference::AbstractTxInReference
          (AbstractTxInReference *this,AbstractTxInReference *param_1)

{
  this->_vptr_AbstractTxInReference = (_func_int **)&PTR__AbstractTxInReference_00649548;
  Txid::Txid(&this->txid_,&param_1->txid_);
  this->vout_ = param_1->vout_;
  Script::Script(&this->unlocking_script_,&param_1->unlocking_script_);
  this->sequence_ = param_1->sequence_;
  ScriptWitness::ScriptWitness(&this->script_witness_,&param_1->script_witness_);
  return;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxInReference {
 public:
  /**
   * @brief constructor.
   * @param[in] tx_in   TxIn instance to reference
   */
  explicit AbstractTxInReference(const AbstractTxIn& tx_in);

  /**
   * @brief destructor.
   */
  virtual ~AbstractTxInReference() {
    // do nothing
  }
  /**
   * @brief Get a txid.
   * @return Txid object.
   */
  Txid GetTxid() const { return txid_; }
  /**
   * @brief Get a vout.
   * @return vout
   */
  uint32_t GetVout() const { return vout_; }
  /**
   * @brief Get an outpoint.
   * @return outpoint
   */
  OutPoint GetOutPoint() const { return OutPoint(txid_, vout_); }
  /**
   * @brief Get an unlocking script.
   * @return unlocking script
   */
  Script GetUnlockingScript() const { return unlocking_script_; }
  /**
   * @brief Get a sequence.
   * @return sequence
   */
  uint32_t GetSequence() const { return sequence_; }
  /**
   * @brief Get a script witness.
   * @return ScriptWitness
   */
  ScriptWitness GetScriptWitness() const { return script_witness_; }
  /**
   * @brief Get a stack number of script witness.
   * @return stack number of script witness.
   */
  uint32_t GetScriptWitnessStackNum() const {
    return script_witness_.GetWitnessNum();
  }

 private:
  Txid txid_;                     ///< txid
  uint32_t vout_;                 ///< vout
  Script unlocking_script_;       ///< unlocking script
  uint32_t sequence_;             ///< sequence no
  ScriptWitness script_witness_;  ///< script witness.
}